

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_resize
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sbyte sVar4;
  Error EVar5;
  char cVar6;
  sbyte sVar7;
  ulong uVar8;
  uint extraout_EDX;
  long *extraout_RDX;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  ZoneVectorBase *pZVar16;
  ZoneVectorBase *pZVar17;
  ZoneVectorBase *pZVar18;
  ZoneVectorBase *pZVar19;
  ulong in_R8;
  long lVar20;
  uint uVar21;
  ZoneVectorBase *pZVar22;
  ZoneVectorBase *unaff_R13;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uStack_bc;
  ZoneVectorBase *pZStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  ZoneVectorBase *pZStack_98;
  ZoneVectorBase *pZStack_90;
  ZoneVectorBase *pZStack_88;
  ZoneVectorBase *pZStack_80;
  code *pcStack_78;
  ulong uStack_70;
  long *plStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uVar15;
  
  uVar14 = this->_size;
  if (n <= this->_capacity) {
LAB_0012d0e1:
    if (uVar14 < n) {
      memset((void *)((ulong)uVar14 * (ulong)sizeOfT + (long)this->_data),0,
             (ulong)(n - uVar14) * (ulong)sizeOfT);
    }
    this->_size = n;
    return 0;
  }
  uVar11 = (ulong)(n - uVar14);
  pZVar17 = this;
  EVar5 = _grow(this,allocator,sizeOfT,n - uVar14);
  if (EVar5 != 0) {
    return EVar5;
  }
  if (n <= this->_capacity) goto LAB_0012d0e1;
  _resize();
  uVar14 = *(uint *)(extraout_RDX + 1);
  uVar8 = (ulong)uVar14;
  if (uVar14 == 0) {
    pZVar17->_size = 0;
    return 0;
  }
  pZVar19 = (ZoneVectorBase *)pZVar17->_data;
  plVar10 = extraout_RDX;
  if (uVar14 <= pZVar17->_capacity) goto LAB_0012d1c7;
  uVar13 = uVar14 + 0x3f & 0xffffffc0;
  uVar15 = (ulong)uVar13;
  if (uVar13 < uVar14) {
    cVar6 = '\0';
    plStack_68 = extraout_RDX;
  }
  else {
    uStack_58 = (ulong)n;
    if (((ZoneVectorBase *)allocator)->_data == (void *)0x0) {
      pcStack_78 = (code *)0x12d247;
      pZVar16 = (ZoneVectorBase *)allocator;
      pZVar18 = pZVar17;
      ZoneBitVector::copyFrom();
LAB_0012d247:
      uVar9 = uVar15;
LAB_0012d1aa:
      uVar13 = (uint)uVar11;
      if (pZVar19 != (ZoneVectorBase *)0x0) {
        if (((ZoneVectorBase *)allocator)->_data == (void *)0x0) {
          pcStack_78 = (code *)0x12d253;
          ZoneBitVector::copyFrom();
        }
        else {
          pZVar18 = (ZoneVectorBase *)(ulong)pZVar17->_capacity;
          uStack_70 = uVar9;
          if (7 < pZVar17->_capacity) {
            uVar11 = uVar11 & 0xffffffff;
            pcStack_78 = (code *)0x12d230;
            ZoneBitVector::copyFrom();
            uVar9 = uStack_70;
            goto LAB_0012d1af;
          }
        }
        pcStack_78 = ZoneBitVector::_resize;
        ZoneBitVector::copyFrom();
        uStack_a0 = uVar15;
        pZStack_98 = (ZoneVectorBase *)allocator;
        pZStack_90 = unaff_R13;
        pZStack_88 = pZVar19;
        pZStack_80 = pZVar17;
        pcStack_78 = (code *)uVar8;
        if (extraout_EDX <= uVar13) {
          uVar15 = (ulong)extraout_EDX;
          uVar14 = pZVar18->_size;
          pZVar22 = (ZoneVectorBase *)(ulong)uVar14;
          if (extraout_EDX <= uVar14) {
            uVar14 = extraout_EDX;
            if ((extraout_EDX & 0x3f) != 0) {
              puVar1 = (ulong *)((long)pZVar18->_data + (ulong)(extraout_EDX >> 6) * 8);
              *puVar1 = *puVar1 & ~(-1L << (sbyte)(extraout_EDX & 0x3f));
            }
            goto LAB_0012d464;
          }
          pZVar17 = (ZoneVectorBase *)pZVar18->_data;
          if (extraout_EDX <= pZVar18->_capacity) goto LAB_0012d32e;
          uVar13 = uVar13 + 0x3f & 0xffffffc0;
          if (uVar13 < extraout_EDX) goto LAB_0012d4b2;
          if (pZVar16->_data != (void *)0x0) {
            uStack_bc = (uint)in_R8;
            pZVar19 = pZVar16;
            unaff_R13 = (ZoneVectorBase *)
                        ZoneAllocator::_alloc
                                  ((ZoneAllocator *)pZVar16,(ulong)(uVar13 >> 3),&uStack_a8);
            pZVar19 = (ZoneVectorBase *)
                      CONCAT71((int7)((ulong)pZVar19 >> 8),unaff_R13 != (ZoneVectorBase *)0x0);
            if (unaff_R13 != (ZoneVectorBase *)0x0) {
              uVar11 = uStack_a8 * 8;
              pZStack_b0 = pZVar16;
              if (uVar11 < uStack_a8) goto LAB_0012d4be;
              goto LAB_0012d2e8;
            }
LAB_0012d31b:
            cVar6 = (char)pZVar19;
            in_R8 = (ulong)uStack_bc;
            goto LAB_0012d320;
          }
          pZVar19 = pZVar18;
          ZoneBitVector::_resize();
LAB_0012d4be:
          uVar11 = (ulong)uVar13;
LAB_0012d2e8:
          if (0x3f < uVar14 + 0x3f) {
            uVar8 = 0;
            do {
              (&unaff_R13->_data)[uVar8] = (&pZVar17->_data)[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar14 + 0x3f >> 6 != uVar8);
          }
          if (pZVar17 == (ZoneVectorBase *)0x0) {
LAB_0012d311:
            pZVar18->_data = unaff_R13;
            pZVar18->_capacity = (size_type)uVar11;
            pZVar17 = unaff_R13;
            goto LAB_0012d31b;
          }
          pZVar16 = pZVar19;
          if (pZStack_b0->_data != (void *)0x0) {
            pZVar16 = (ZoneVectorBase *)(ulong)pZVar18->_capacity;
            if (pZVar18->_capacity < 8) goto LAB_0012d4d0;
            ZoneBitVector::_resize();
            pZVar19 = (ZoneVectorBase *)((ulong)pZVar19 & 0xffffffff);
            goto LAB_0012d311;
          }
LAB_0012d4cb:
          ZoneBitVector::_resize();
LAB_0012d4d0:
          uVar13 = (uint)pZStack_b0;
          ZoneBitVector::_resize();
          uVar14 = 0xcb;
          if (uVar13 < 0xcb) {
            uVar14 = uVar13;
          }
          EVar5 = String::_opString((String *)pZVar16,kAppend,
                                    "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                             [uVar14],0xffffffffffffffff);
          return EVar5;
        }
        ZoneBitVector::_resize();
        pZVar22 = (ZoneVectorBase *)allocator;
        pZVar18 = pZVar19;
LAB_0012d4b2:
        cVar6 = '\0';
LAB_0012d320:
        if (cVar6 == '\0') {
          return 1;
        }
LAB_0012d32e:
        pZVar16 = (ZoneVectorBase *)((ulong)pZVar22 >> 6 & 0x3ffffff);
        uVar13 = (uint)pZVar16;
        uVar14 = (uint)uVar15;
        sVar4 = (sbyte)(uVar14 & 0x3f);
        pvVar12 = (void *)-(in_R8 & 0xff);
        uVar21 = (uint)pZVar22 & 0x3f;
        if (((ulong)pZVar22 & 0x3f) != 0) {
          pZStack_b0 = (ZoneVectorBase *)(uVar15 >> 6);
          sVar7 = 0;
          if ((uVar13 == (uint)pZStack_b0) && (sVar7 = sVar4, (uVar14 & 0x3f) <= uVar21)) {
            ZoneBitVector::_resize();
            goto LAB_0012d4cb;
          }
          (&pZVar17->_data)[(long)pZVar16] =
               (void *)((ulong)(&pZVar17->_data)[(long)pZVar16] |
                       (long)pvVar12 << (sVar7 - (char)uVar21 & 0x3fU));
          uVar13 = uVar13 + 1;
        }
        auVar3 = _DAT_00150c20;
        auVar2 = _DAT_00150c10;
        uVar21 = uVar14 + 0x3f >> 6;
        if (uVar13 < uVar21) {
          uVar11 = (ulong)uVar13;
          lVar20 = (uVar21 - uVar11) + -1;
          auVar23._8_4_ = (int)lVar20;
          auVar23._0_8_ = lVar20;
          auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
          uVar8 = 0;
          auVar23 = auVar23 ^ _DAT_00150c20;
          do {
            auVar24._8_4_ = (int)uVar8;
            auVar24._0_8_ = uVar8;
            auVar24._12_4_ = (int)(uVar8 >> 0x20);
            auVar24 = (auVar24 | auVar2) ^ auVar3;
            if ((bool)(~(auVar24._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar24._0_4_ ||
                        auVar23._4_4_ < auVar24._4_4_) & 1)) {
              (&pZVar17->_data)[uVar11 + uVar8] = pvVar12;
            }
            if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
                auVar24._12_4_ <= auVar23._12_4_) {
              *(void **)(&pZVar17->_size + uVar11 * 2 + uVar8 * 2) = pvVar12;
            }
            uVar8 = uVar8 + 2;
          } while (((uVar21 - uVar11) + 1 & 0xfffffffffffffffe) != uVar8);
        }
        if ((uVar15 & 0x3f) != 0) {
          pvVar12 = (void *)0x0;
          if ((char)in_R8 != '\0') {
            pvVar12 = (void *)~(-1L << sVar4);
          }
          (&pZVar17->_data)[uVar21 - 1] = pvVar12;
        }
LAB_0012d464:
        pZVar18->_size = uVar14;
        return 0;
      }
LAB_0012d1af:
      pZVar17->_data = unaff_R13;
      pZVar17->_capacity = (size_type)uVar9;
      pZVar19 = unaff_R13;
    }
    else {
      pZVar16 = (ZoneVectorBase *)(ulong)(uVar13 >> 3);
      pcStack_78 = (code *)0x12d189;
      pZVar18 = (ZoneVectorBase *)allocator;
      plStack_68 = extraout_RDX;
      unaff_R13 = (ZoneVectorBase *)ZoneAllocator::_alloc(allocator,(size_t)pZVar16,&uStack_60);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),unaff_R13 != (ZoneVectorBase *)0x0);
      if (unaff_R13 != (ZoneVectorBase *)0x0) {
        uVar9 = uStack_60 * 8;
        if (uStack_60 * 8 < uStack_60) goto LAB_0012d247;
        goto LAB_0012d1aa;
      }
    }
    cVar6 = (char)uVar11;
  }
  plVar10 = plStack_68;
  if (cVar6 == '\0') {
    return 1;
  }
LAB_0012d1c7:
  pZVar17->_size = uVar14;
  if (0x3f < uVar14 + 0x3f) {
    lVar20 = *plVar10;
    uVar11 = 0;
    do {
      (&pZVar19->_data)[uVar11] = *(void **)(lVar20 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while (uVar14 + 0x3f >> 6 != uVar11);
  }
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t size = _size;

  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(allocator, sizeOfT, n - size));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (size < n)
    memset(static_cast<uint8_t*>(_data) + size_t(size) * sizeOfT, 0, size_t(n - size) * sizeOfT);

  _size = n;
  return kErrorOk;
}